

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void * duckdb_je_arena_malloc_hard
                 (tsdn_t *tsdn,arena_t *arena,size_t size,szind_t ind,_Bool zero,_Bool slab)

{
  tcache_slow_t *tcache_slow;
  tcache_t *tcache;
  size_t *psVar1;
  uint64_t *puVar2;
  pac_decay_stats_t *ppVar3;
  locked_u64_t *plVar4;
  char cVar5;
  arena_t *paVar6;
  uint64_t uVar7;
  int iVar8;
  void *pvVar9;
  edata_t *slab_00;
  szind_t binind;
  ulong uVar10;
  ulong uVar11;
  mutex_prof_data_t *data;
  szind_t binshard;
  pthread_mutex_t *__mutex;
  size_t local_38;
  
  if (tsdn == (tsdn_t *)0x0) {
LAB_00cdcda5:
    if (arena != (arena_t *)0x0) {
      if (!slab) goto LAB_00cdd068;
      local_38 = duckdb_je_sz_index2size_tab[ind];
      if (tsdn != (tsdn_t *)0x0) goto LAB_00cdcd69;
      goto LAB_00cdcdd2;
    }
LAB_00cdcfc0:
    pvVar9 = (void *)0x0;
  }
  else {
    if (arena == (arena_t *)0x0) {
      arena = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
      if (arena == (arena_t *)0x0) {
        if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level <
            '\x01') {
          arena = duckdb_je_arena_choose_hard(&tsdn->tsd,false);
          if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled ==
              true) {
            tcache_slow = &(tsdn->tsd).
                           cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow;
            tcache = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
            paVar6 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                     arena;
            if (paVar6 == (arena_t *)0x0) {
              duckdb_je_tcache_arena_associate(tsdn,tcache_slow,tcache,arena);
            }
            else if (paVar6 != arena) {
              duckdb_je_tcache_arena_reassociate(tsdn,tcache_slow,tcache,arena);
            }
          }
        }
        else {
          arena = (arena_t *)duckdb_je_arenas[0].repr;
          if (duckdb_je_arenas[0].repr == (void *)0x0) {
            arena = duckdb_je_arena_init(tsdn,0,&duckdb_je_arena_config_default);
          }
        }
      }
      if (((arena->pa_shard).pac.duckdb_je_oversize_threshold.repr <= size) &&
         (arena->ind < duckdb_je_manual_arena_base)) {
        arena = duckdb_je_arena_choose_huge(&tsdn->tsd);
        goto LAB_00cdcda5;
      }
    }
    if (!slab) {
LAB_00cdd068:
      pvVar9 = duckdb_je_large_malloc(tsdn,arena,duckdb_je_sz_index2size_tab[ind],zero);
      return pvVar9;
    }
    local_38 = duckdb_je_sz_index2size_tab[ind];
LAB_00cdcd69:
    if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena == (arena_t *)0x0) {
LAB_00cdcdd2:
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                      binshard[ind];
    }
    binind = 0x26f89e0;
    binshard = (szind_t)uVar10;
    uVar11 = (ulong)(binshard << 8);
    if (ind < duckdb_je_bin_info_nbatched_sizes) {
      uVar11 = uVar10 * 0x288;
    }
    paVar6 = (arena_t *)((long)&arena->nthreads[0].repr + uVar11 + duckdb_je_arena_bin_offsets[ind])
    ;
    __mutex = (pthread_mutex_t *)
              ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr +
              uVar11 + duckdb_je_arena_bin_offsets[ind]);
    iVar8 = pthread_mutex_trylock(__mutex);
    if (iVar8 != 0) {
      duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)paVar6);
      *(undefined1 *)&(paVar6->stats).mapped = 1;
    }
    psVar1 = &(paVar6->stats).metadata_thp;
    *psVar1 = *psVar1 + 1;
    if ((tsdn_t *)(paVar6->stats).resident != tsdn) {
      (paVar6->stats).resident = (size_t)tsdn;
      psVar1 = &(paVar6->stats).metadata_rtree;
      *psVar1 = *psVar1 + 1;
    }
    pvVar9 = arena_bin_malloc_no_fresh_slab((tsdn_t *)arena,paVar6,(bin_t *)(ulong)ind,binind);
    if (pvVar9 == (void *)0x0) {
      *(undefined1 *)&(paVar6->stats).mapped = 0;
      pthread_mutex_unlock(__mutex);
      slab_00 = arena_slab_alloc(tsdn,arena,ind,binshard,duckdb_je_bin_infos + ind);
      iVar8 = pthread_mutex_trylock(__mutex);
      if (iVar8 != 0) {
        duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)paVar6);
        *(undefined1 *)&(paVar6->stats).mapped = 1;
      }
      psVar1 = &(paVar6->stats).metadata_thp;
      *psVar1 = *psVar1 + 1;
      if ((tsdn_t *)(paVar6->stats).resident != tsdn) {
        (paVar6->stats).resident = (size_t)tsdn;
        psVar1 = &(paVar6->stats).metadata_rtree;
        *psVar1 = *psVar1 + 1;
      }
      pvVar9 = arena_bin_malloc_no_fresh_slab((tsdn_t *)arena,paVar6,(bin_t *)(ulong)ind,binshard);
      if (pvVar9 == (void *)0x0) {
        if (slab_00 == (edata_t *)0x0) {
          *(undefined1 *)&(paVar6->stats).mapped = 0;
          pthread_mutex_unlock(__mutex);
          goto LAB_00cdcfc0;
        }
        ppVar3 = &(paVar6->stats).pa_shard_stats.pac_stats.decay_muzzy;
        (ppVar3->npurge).val.repr = (ppVar3->npurge).val.repr + 1;
        plVar4 = &(paVar6->stats).pa_shard_stats.pac_stats.decay_muzzy.purged;
        (plVar4->val).repr = (plVar4->val).repr + 1;
        (paVar6->stats).mutex_prof_data[0].tot_wait_time.ns = (uint64_t)slab_00;
        pvVar9 = arena_slab_reg_alloc(slab_00,duckdb_je_bin_infos + ind);
        slab_00 = (edata_t *)0x0;
      }
    }
    else {
      slab_00 = (edata_t *)0x0;
    }
    puVar2 = &(paVar6->stats).nflushes_large;
    *puVar2 = *puVar2 + 1;
    uVar7 = (paVar6->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr;
    (paVar6->stats).pa_shard_stats.edata_avail = (paVar6->stats).pa_shard_stats.edata_avail + 1;
    (paVar6->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr = uVar7 + 1;
    *(undefined1 *)&(paVar6->stats).mapped = 0;
    pthread_mutex_unlock(__mutex);
    if (slab_00 != (edata_t *)0x0) {
      duckdb_je_arena_slab_dalloc(tsdn,arena,slab_00);
    }
    if (zero) {
      switchD_01043a80::default(pvVar9,0,local_38);
    }
    if (tsdn != (tsdn_t *)0x0) {
      cVar5 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      iVar8 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
              tick;
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
           iVar8 + -1;
      if (iVar8 < 1) {
        if (cVar5 < '\x01') {
          uVar10 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                   0x5851f42d4c957f2d + 0x14057b7ef767814f;
          (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar10;
          (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick
               = (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar10 >> 0x3a] *
                           (long)(tsdn->tsd).
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                 .nticks) / 0x3d);
          duckdb_je_arena_decay(tsdn,arena,false,false);
        }
        else {
          (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick
               = 0;
        }
      }
    }
  }
  return pvVar9;
}

Assistant:

void *
arena_malloc_hard(tsdn_t *tsdn, arena_t *arena, size_t size, szind_t ind,
    bool zero, bool slab) {
	assert(!tsdn_null(tsdn) || arena != NULL);

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, size);
	}
	if (unlikely(arena == NULL)) {
		return NULL;
	}

	if (likely(slab)) {
		assert(sz_can_use_slab(size));
		return arena_malloc_small(tsdn, arena, ind, zero);
	} else {
		return large_malloc(tsdn, arena, sz_index2size(ind), zero);
	}
}